

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O1

void Tests::AddExpressionEvaluionFail(char *reason)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar2 = expressionEvaluionFails;
  uVar7 = (ulong)expressionEvaluionFails;
  bVar8 = uVar7 != 0;
  if (bVar8) {
    iVar3 = strcmp(expressionEvaluionFailInfo,reason);
    puVar6 = &expressionEvaluionFailInfo;
    if (iVar3 != 0) {
      puVar6 = &expressionEvaluionFailInfo;
      uVar5 = 0;
      do {
        if (uVar7 - 1 == uVar5) goto LAB_00184f6f;
        puVar1 = puVar6 + 2;
        puVar6 = puVar6 + 2;
        iVar3 = strcmp((char *)*puVar1,reason);
        uVar5 = uVar5 + 1;
      } while (iVar3 != 0);
      bVar8 = uVar5 < uVar7;
    }
    *(int *)(puVar6 + 1) = *(int *)(puVar6 + 1) + 1;
    if (bVar8) {
      return;
    }
  }
LAB_00184f6f:
  if (uVar2 < 0x80) {
    pcVar4 = strdup(reason);
    (&expressionEvaluionFailInfo)[uVar7 * 2] = pcVar4;
    (&DAT_003fceb8)[uVar7 * 4] = 1;
    expressionEvaluionFails = uVar2 + 1;
    return;
  }
  __assert_fail("expressionEvaluionFails < 128",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/TestBase.cpp"
                ,0xd5,"void Tests::AddExpressionEvaluionFail(const char *)");
}

Assistant:

void AddExpressionEvaluionFail(const char *reason)
	{
		for(unsigned i = 0; i < expressionEvaluionFails; i++)
		{
			if(strcmp(expressionEvaluionFailInfo[i].reason, reason) == 0)
			{
				expressionEvaluionFailInfo[i].count++;
				return;
			}
		}
		assert(expressionEvaluionFails < 128);

		if(expressionEvaluionFails < 128)
		{
			expressionEvaluionFailInfo[expressionEvaluionFails].reason = strdup(reason);
			expressionEvaluionFailInfo[expressionEvaluionFails].count = 1;
			expressionEvaluionFails++;
		}
	}